

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall ViewTest::indexToCoordinatesTest<false>(ViewTest *this)

{
  unsigned_long uVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var2;
  unsigned_long *puVar3;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var4;
  logic_error *plVar5;
  value_type *__val;
  value_type *__val_2;
  size_t sVar6;
  value_type *__val_4;
  value_type *__val_3;
  value_type *__val_1;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  allocator_type local_79;
  CoordinateOrder local_78 [2];
  undefined1 local_70 [16];
  size_t *local_60;
  size_t local_48;
  
  _Var2._M_current = (unsigned_long *)operator_new(0x18);
  *_Var2._M_current = 0;
  _Var2._M_current[1] = 0;
  *_Var2._M_current = 3;
  _Var2._M_current[1] = 2;
  _Var2._M_current[2] = 4;
  local_78[1] = 1;
  local_78[0] = LastMajorOrder;
  local_70._0_8_ = this->data_;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_70 + 8),_Var2,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var2._M_current + 3),local_78 + 1,local_78,&local_79);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_70);
  puVar3 = (unsigned_long *)operator_new(0x18);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  if (_Var2._M_current[2] != 0) {
    sVar6 = 0;
    do {
      puVar3[1] = 0;
      if (_Var2._M_current[1] != 0) {
        do {
          *puVar3 = 0;
          if (*_Var2._M_current != 0) {
            do {
              _Var4._M_current = (unsigned_long *)operator_new(0x18);
              *_Var4._M_current = 0;
              _Var4._M_current[1] = 0;
              _Var4._M_current[2] = 0;
              andres::View<int,false,std::allocator<unsigned_long>>::
              indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((View<int,false,std::allocator<unsigned_long>> *)local_70,sVar6,_Var4);
              if (((*_Var4._M_current != *puVar3) || (_Var4._M_current[1] != puVar3[1])) ||
                 (_Var4._M_current[2] != puVar3[2])) {
                plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar5,"test failed.");
                __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
              sVar6 = sVar6 + 1;
              operator_delete(_Var4._M_current,0x18);
              uVar1 = *puVar3;
              *puVar3 = uVar1 + 1;
            } while (uVar1 + 1 < *_Var2._M_current);
          }
          uVar1 = puVar3[1];
          puVar3[1] = uVar1 + 1;
        } while (uVar1 + 1 < _Var2._M_current[1]);
      }
      uVar1 = puVar3[2];
      puVar3[2] = uVar1 + 1;
    } while (uVar1 + 1 < _Var2._M_current[2]);
  }
  operator_delete(puVar3,0x18);
  operator_delete(local_60,local_48 * 0x18);
  operator_delete(_Var2._M_current,0x18);
  _Var2._M_current = (unsigned_long *)operator_new(0x18);
  *_Var2._M_current = 0;
  _Var2._M_current[1] = 0;
  *_Var2._M_current = 3;
  _Var2._M_current[1] = 2;
  _Var2._M_current[2] = 4;
  local_78[1] = 1;
  local_78[0] = FirstMajorOrder;
  local_70._0_8_ = this->data_;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_70 + 8),_Var2,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var2._M_current + 3),local_78 + 1,local_78,&local_79);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_70);
  puVar3 = (unsigned_long *)operator_new(0x18);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  if (*_Var2._M_current != 0) {
    sVar6 = 0;
    do {
      puVar3[1] = 0;
      if (_Var2._M_current[1] != 0) {
        do {
          puVar3[2] = 0;
          if (_Var2._M_current[2] != 0) {
            do {
              _Var4._M_current = (unsigned_long *)operator_new(0x18);
              *_Var4._M_current = 0;
              _Var4._M_current[1] = 0;
              _Var4._M_current[2] = 0;
              andres::View<int,false,std::allocator<unsigned_long>>::
              indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((View<int,false,std::allocator<unsigned_long>> *)local_70,sVar6,_Var4);
              if (((*_Var4._M_current != *puVar3) || (_Var4._M_current[1] != puVar3[1])) ||
                 (_Var4._M_current[2] != puVar3[2])) {
                plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar5,"test failed.");
                __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
              sVar6 = sVar6 + 1;
              operator_delete(_Var4._M_current,0x18);
              uVar1 = puVar3[2];
              puVar3[2] = uVar1 + 1;
            } while (uVar1 + 1 < _Var2._M_current[2]);
          }
          uVar1 = puVar3[1];
          puVar3[1] = uVar1 + 1;
        } while (uVar1 + 1 < _Var2._M_current[1]);
      }
      uVar1 = *puVar3;
      *puVar3 = uVar1 + 1;
    } while (uVar1 + 1 < *_Var2._M_current);
  }
  operator_delete(puVar3,0x18);
  operator_delete(local_60,local_48 * 0x18);
  operator_delete(_Var2._M_current,0x18);
  return;
}

Assistant:

void ViewTest::indexToCoordinatesTest() {
    // internalFirstMajorOrder == false
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::LastMajorOrder);

        std::vector<std::size_t> c(3);
        std::size_t index = 0;
        for(c[2]=0; c[2]<shape[2]; ++c[2]) 
        for(c[1]=0; c[1]<shape[1]; ++c[1])
        for(c[0]=0; c[0]<shape[0]; ++c[0]) {
            std::vector<std::size_t> d(3);
            v.indexToCoordinates(index, d.begin());
            test(d[0] == c[0] && d[1] == c[1] && d[2] == c[2]);
            ++index;
        }
    }
    // internalFirstMajorOrder == true
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::FirstMajorOrder);

        std::vector<std::size_t> c(3);
        std::size_t index = 0;
        for(c[0]=0; c[0]<shape[0]; ++c[0]) 
        for(c[1]=0; c[1]<shape[1]; ++c[1])
        for(c[2]=0; c[2]<shape[2]; ++c[2]) {
            std::vector<std::size_t> d(3);
            v.indexToCoordinates(index, d.begin());
            test(d[0] == c[0] && d[1] == c[1] && d[2] == c[2]);
            ++index;
        }
    }
}